

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O2

void __thiscall OpenMD::HBondJump::postCorrelate(HBondJump *this)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  uint i;
  ulong uVar5;
  double dVar6;
  
  uVar1 = (this->super_TimeCorrFunc<double>).nTimeBins_;
  piVar3 = (this->super_TimeCorrFunc<double>).count_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar4 = (this->super_TimeCorrFunc<double>).histogram_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
    iVar2 = piVar3[uVar5];
    if (iVar2 < 1) {
      dVar6 = 0.0;
    }
    else {
      dVar6 = pdVar4[uVar5] / (double)iVar2;
    }
    pdVar4[uVar5] = 1.0 - dVar6;
  }
  return;
}

Assistant:

void HBondJump::postCorrelate() {
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      if (count_[i] > 0) {
        histogram_[i] /= count_[i];
      } else {
        histogram_[i] = 0;
      }
      histogram_[i] = 1.0 - histogram_[i];
    }
  }